

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Ptr_t * Pdr_ManCollectCubes(Pdr_Man_t *p,int kStart)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void *Entry;
  int local_38;
  int local_34;
  int j;
  int i;
  Pdr_Set_t *pSet;
  Vec_Ptr_t *vArrayK;
  Vec_Ptr_t *vResult;
  int kStart_local;
  Pdr_Man_t *p_local;
  
  p_00 = Vec_PtrAlloc(100);
  for (local_34 = kStart; iVar1 = Vec_VecSize(p->vClauses), local_34 < iVar1;
      local_34 = local_34 + 1) {
    p_01 = Vec_VecEntry(p->vClauses,local_34);
    for (local_38 = 0; iVar1 = Vec_PtrSize(p_01), local_38 < iVar1; local_38 = local_38 + 1) {
      Entry = Vec_PtrEntry(p_01,local_38);
      Vec_PtrPush(p_00,Entry);
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Pdr_ManCollectCubes( Pdr_Man_t * p, int kStart )
{
    Vec_Ptr_t * vResult;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pSet;
    int i, j;
    vResult = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, kStart )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pSet, j )
            Vec_PtrPush( vResult, pSet );
    return vResult;
}